

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_double<double,fmt::FormatSpec>
          (BasicWriter<char> *this,double value,FormatSpec *spec)

{
  Buffer<char> *pBVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Alignment AVar6;
  wchar_t wVar7;
  uint uVar8;
  size_t sVar9;
  CharPtr pcVar10;
  char *__src;
  char *pcVar11;
  ulong uVar12;
  uint local_e4;
  char *local_d0;
  char *local_c8;
  char local_b9;
  CharPtr p;
  int result;
  size_t buffer_size;
  char *start;
  uint n;
  char fill;
  char *pcStack_78;
  uint width_for_sprintf;
  char *format_ptr;
  char format [10];
  uint width;
  size_t offset;
  CharPtr out_1;
  char *inf;
  size_t inf_size;
  CharPtr out;
  char *nan;
  size_t nan_size;
  char sign;
  bool upper;
  char type;
  FormatSpec *spec_local;
  double value_local;
  BasicWriter<char> *this_local;
  
  nan_size._7_1_ = FormatSpec::type(spec);
  bVar3 = false;
  iVar5 = (int)nan_size._7_1_;
  if (nan_size._7_1_ == '\0') {
    nan_size._7_1_ = 'g';
  }
  else if ((iVar5 == 0x41) || (iVar5 - 0x45U < 3)) {
    bVar3 = true;
  }
  else if ((iVar5 != 0x61) && (2 < iVar5 - 0x65U)) {
    internal::report_unknown_type(nan_size._7_1_,"double");
  }
  nan_size._5_1_ = '\0';
  bVar2 = std::numeric_limits<fmt::internal::DummyInt>::isnegative(value);
  if (bVar2) {
    nan_size._5_1_ = '-';
    spec_local = (FormatSpec *)((ulong)value ^ 0x8000000000000000);
  }
  else {
    bVar2 = FormatSpec::flag(spec,1);
    spec_local = (FormatSpec *)value;
    if (bVar2) {
      bVar2 = FormatSpec::flag(spec,2);
      local_b9 = '+';
      if (!bVar2) {
        local_b9 = ' ';
      }
      nan_size._5_1_ = local_b9;
    }
  }
  bVar2 = std::numeric_limits<fmt::internal::DummyInt>::isnotanumber<double>((double)spec_local);
  if (bVar2) {
    nan = (char *)0x4;
    if (bVar3) {
      local_c8 = " NAN";
    }
    else {
      local_c8 = " nan";
    }
    out = local_c8;
    if (nan_size._5_1_ == '\0') {
      nan = (char *)0x3;
      out = local_c8 + 1;
    }
    pcVar10 = write_str<char>(this,out,(size_t)nan,&spec->super_AlignSpec);
    if (nan_size._5_1_ != '\0') {
      *pcVar10 = nan_size._5_1_;
    }
  }
  else {
    bVar2 = std::numeric_limits<fmt::internal::DummyInt>::isinfinity<double>((double)spec_local);
    if (bVar2) {
      inf = (char *)0x4;
      if (bVar3) {
        local_d0 = " INF";
      }
      else {
        local_d0 = " inf";
      }
      out_1 = local_d0;
      if (nan_size._5_1_ == '\0') {
        inf = (char *)0x3;
        out_1 = local_d0 + 1;
      }
      pcVar10 = write_str<char>(this,out_1,(size_t)inf,&spec->super_AlignSpec);
      if (nan_size._5_1_ != '\0') {
        *pcVar10 = nan_size._5_1_;
      }
    }
    else {
      register0x00000000 = Buffer<char>::size(this->buffer_);
      format._2_4_ = WidthSpec::width((WidthSpec *)spec);
      if (nan_size._5_1_ != '\0') {
        pBVar1 = this->buffer_;
        sVar9 = Buffer<char>::size(this->buffer_);
        if ((uint)format._2_4_ < 2) {
          local_e4 = 1;
        }
        else {
          local_e4._0_1_ = format[2];
          local_e4._1_1_ = format[3];
          local_e4._2_1_ = format[4];
          local_e4._3_1_ = format[5];
        }
        Buffer<char>::reserve(pBVar1,sVar9 + local_e4);
        if (format._2_4_ != 0) {
          format._2_4_ = format._2_4_ + -1;
        }
        register0x00000000 = stack0xffffffffffffffa0 + 1;
      }
      pcStack_78 = (char *)((long)&format_ptr + 3);
      format_ptr._2_1_ = 0x25;
      n._0_1_ = format[2];
      n._1_1_ = format[3];
      n._2_1_ = format[4];
      n._3_1_ = format[5];
      bVar3 = FormatSpec::flag(spec,8);
      if (bVar3) {
        pcVar11 = pcStack_78 + 1;
        *pcStack_78 = '#';
        pcStack_78 = pcVar11;
      }
      AVar6 = AlignSpec::align(&spec->super_AlignSpec);
      if (AVar6 == ALIGN_CENTER) {
        n = 0;
      }
      else {
        AVar6 = AlignSpec::align(&spec->super_AlignSpec);
        if (AVar6 == ALIGN_LEFT) {
          *pcStack_78 = '-';
          pcStack_78 = pcStack_78 + 1;
        }
        if (format._2_4_ != 0) {
          *pcStack_78 = '*';
          pcStack_78 = pcStack_78 + 1;
        }
      }
      iVar5 = FormatSpec::precision(spec);
      if (-1 < iVar5) {
        pcVar11 = pcStack_78 + 1;
        *pcStack_78 = '.';
        pcStack_78 = pcStack_78 + 2;
        *pcVar11 = '*';
      }
      append_float_length<double>(this,&stack0xffffffffffffff88,(double)spec_local);
      *pcStack_78 = nan_size._7_1_;
      pcStack_78[1] = '\0';
      pcStack_78 = pcStack_78 + 1;
      wVar7 = WidthSpec::fill((WidthSpec *)spec);
      cVar4 = internal::BasicCharTraits<char>::cast(wVar7);
      while( true ) {
        while( true ) {
          sVar9 = Buffer<char>::capacity(this->buffer_);
          sVar9 = sVar9 - stack0xffffffffffffffa0;
          buffer_size = (size_t)Buffer<char>::operator[](this->buffer_,stack0xffffffffffffffa0);
          iVar5 = FormatSpec::precision(spec);
          iVar5 = internal::CharTraits<char>::format_float<double>
                            ((char *)buffer_size,sVar9,(char *)((long)&format_ptr + 2),n,iVar5,
                             (double)spec_local);
          if (-1 < iVar5) break;
          pBVar1 = this->buffer_;
          sVar9 = Buffer<char>::capacity(this->buffer_);
          Buffer<char>::reserve(pBVar1,sVar9 + 1);
        }
        start._4_4_ = internal::to_unsigned<int>(iVar5);
        uVar12 = stack0xffffffffffffffa0 + start._4_4_;
        sVar9 = Buffer<char>::capacity(this->buffer_);
        if (uVar12 < sVar9) break;
        Buffer<char>::reserve(this->buffer_,stack0xffffffffffffffa0 + start._4_4_ + 1);
      }
      if (nan_size._5_1_ != '\0') {
        AVar6 = AlignSpec::align(&spec->super_AlignSpec);
        if (((AVar6 == ALIGN_RIGHT) ||
            (AVar6 = AlignSpec::align(&spec->super_AlignSpec), AVar6 == ALIGN_DEFAULT)) &&
           (*(char *)buffer_size == ' ')) {
          *(char *)(buffer_size + -1) = cVar4;
        }
        else {
          *(char *)(buffer_size + -1) = nan_size._5_1_;
          nan_size._5_1_ = '\0';
        }
        start._4_4_ = start._4_4_ + 1;
      }
      AVar6 = AlignSpec::align(&spec->super_AlignSpec);
      if ((AVar6 == ALIGN_CENTER) &&
         (uVar8 = WidthSpec::width((WidthSpec *)spec), start._4_4_ < uVar8)) {
        format._2_4_ = WidthSpec::width((WidthSpec *)spec);
        pcVar10 = grow_buffer(this,(ulong)(uint)format._2_4_);
        pcVar11 = get(pcVar10);
        uVar8 = format._2_4_ - start._4_4_;
        __src = get(pcVar10);
        memmove(pcVar11 + (uVar8 >> 1),__src,(ulong)start._4_4_);
        uVar8 = WidthSpec::width((WidthSpec *)spec);
        fill_padding(pcVar10,uVar8,(ulong)start._4_4_,(int)cVar4);
      }
      else {
        wVar7 = WidthSpec::fill((WidthSpec *)spec);
        if ((wVar7 != L' ') || (nan_size._5_1_ != '\0')) {
          while (*(char *)buffer_size == ' ') {
            *(char *)buffer_size = cVar4;
            buffer_size = buffer_size + 1;
          }
          if (nan_size._5_1_ != '\0') {
            *(char *)(buffer_size - 1) = nan_size._5_1_;
          }
        }
        grow_buffer(this,(ulong)start._4_4_);
      }
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const Spec &spec)
{
    // Check type.
    char type = spec.type();
    bool upper = false;
    switch (type)
    {
    case 0:
        type = 'g';
        break;
    case 'e':
    case 'f':
    case 'g':
    case 'a':
        break;
    case 'F':
#if FMT_MSC_VER
        // MSVC's printf doesn't support 'F'.
        type = 'f';
#endif
    // Fall through.
    case 'E':
    case 'G':
    case 'A':
        upper = true;
        break;
    default:
        internal::report_unknown_type(type, "double");
        break;
    }

    char sign = 0;
    // Use isnegative instead of value < 0 because the latter is always
    // false for NaN.
    if (internal::FPUtil::isnegative(static_cast<double>(value)))
    {
        sign = '-';
        value = -value;
    }
    else if (spec.flag(SIGN_FLAG))
    {
        sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
    }

    if (internal::FPUtil::isnotanumber(value))
    {
        // Format NaN ourselves because sprintf's output is not consistent
        // across platforms.
        std::size_t nan_size = 4;
        const char *nan = upper ? " NAN" : " nan";
        if (!sign)
        {
            --nan_size;
            ++nan;
        }
        CharPtr out = write_str(nan, nan_size, spec);
        if (sign)
            *out = sign;
        return;
    }

    if (internal::FPUtil::isinfinity(value))
    {
        // Format infinity ourselves because sprintf's output is not consistent
        // across platforms.
        std::size_t inf_size = 4;
        const char *inf = upper ? " INF" : " inf";
        if (!sign)
        {
            --inf_size;
            ++inf;
        }
        CharPtr out = write_str(inf, inf_size, spec);
        if (sign)
            *out = sign;
        return;
    }

    std::size_t offset = buffer_.size();
    unsigned width = spec.width();
    if (sign)
    {
        buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
        if (width > 0)
            --width;
        ++offset;
    }

    // Build format string.
    enum
    {
        MAX_FORMAT_SIZE = 10
    }; // longest format: %#-*.*Lg
    Char format[MAX_FORMAT_SIZE];
    Char *format_ptr = format;
    *format_ptr++ = '%';
    unsigned width_for_sprintf = width;
    if (spec.flag(HASH_FLAG))
        *format_ptr++ = '#';
    if (spec.align() == ALIGN_CENTER)
    {
        width_for_sprintf = 0;
    }
    else
    {
        if (spec.align() == ALIGN_LEFT)
            *format_ptr++ = '-';
        if (width != 0)
            *format_ptr++ = '*';
    }
    if (spec.precision() >= 0)
    {
        *format_ptr++ = '.';
        *format_ptr++ = '*';
    }

    append_float_length(format_ptr, value);
    *format_ptr++ = type;
    *format_ptr = '\0';

    // Format using snprintf.
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    unsigned n = 0;
    Char *start = FMT_NULL;
    for (;;)
    {
        std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
        // MSVC's vsnprintf_s doesn't work with zero size, so reserve
        // space for at least one extra character to make the size non-zero.
        // Note that the buffer's capacity will increase by more than 1.
        if (buffer_size == 0)
        {
            buffer_.reserve(offset + 1);
            buffer_size = buffer_.capacity() - offset;
        }
#endif
        start = &buffer_[offset];
        int result = internal::CharTraits<Char>::format_float(start, buffer_size, format, width_for_sprintf, spec.precision(), value);
        if (result >= 0)
        {
            n = internal::to_unsigned(result);
            if (offset + n < buffer_.capacity())
                break; // The buffer is large enough - continue with formatting.
            buffer_.reserve(offset + n + 1);
        }
        else
        {
            // If result is negative we ask to increase the capacity by at least 1,
            // but as std::vector, the buffer grows exponentially.
            buffer_.reserve(buffer_.capacity() + 1);
        }
    }
    if (sign)
    {
        if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) || *start != ' ')
        {
            *(start - 1) = sign;
            sign = 0;
        }
        else
        {
            *(start - 1) = fill;
        }
        ++n;
    }
    if (spec.align() == ALIGN_CENTER && spec.width() > n)
    {
        width = spec.width();
        CharPtr p = grow_buffer(width);
        std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
        fill_padding(p, spec.width(), n, fill);
        return;
    }
    if (spec.fill() != ' ' || sign)
    {
        while (*start == ' ')
            *start++ = fill;
        if (sign)
            *(start - 1) = sign;
    }
    grow_buffer(n);
}